

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::DeadCodeEliminationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,DeadCodeEliminationCase *this,bool optimized)

{
  CaseShaderType CVar1;
  bool useConst;
  undefined1 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  pointer *ppbVar6;
  long *plVar7;
  pointer *ppcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  size_type *psVar11;
  int iVar12;
  pointer pcVar13;
  undefined8 uVar14;
  string statements;
  size_type __dnew_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew_6;
  size_type __dnew;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  long local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e8;
  long local_3e0;
  pointer local_3d8;
  long lStack_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  pointer local_358;
  long lStack_350;
  long *local_348;
  undefined8 local_340;
  long local_338;
  undefined8 uStack_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  pointer local_2d8;
  undefined8 uStack_2d0;
  pointer *local_2c8;
  long local_2c0;
  pointer local_2b8;
  long lStack_2b0;
  pointer local_2a8 [2];
  undefined1 local_298 [48];
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [3];
  ios_base local_158 [264];
  string local_50;
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_408._M_dataplus._M_p = (pointer)((long)&local_408 + 0x10);
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    puVar2 = (undefined1 *)((long)&local_408 + 0x17);
    local_408.field_2._M_local_buf[4] = 'u';
    local_408.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_408.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_408._M_string_length = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
      goto switchD_01041b92_default;
    }
    puVar2 = (undefined1 *)((long)&local_408 + 0x15);
    local_408.field_2._M_local_buf[4] = 'p';
    local_408.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_408._M_string_length = 5;
  }
  *puVar2 = 0;
  if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    iVar12 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (optimized) {
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,local_408._M_dataplus._M_p,
                 local_408._M_dataplus._M_p + local_408._M_string_length);
      std::__cxx11::string::append(local_2e8._M_local_buf);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 (local_2e8._M_local_buf,(ulong)local_408._M_dataplus._M_p);
      local_2c8 = &local_2b8;
      ppbVar6 = (pointer *)(plVar3 + 2);
      if ((pointer *)*plVar3 == ppbVar6) {
        local_2b8 = *ppbVar6;
        lStack_2b0 = plVar3[3];
      }
      else {
        local_2b8 = *ppbVar6;
        local_2c8 = (pointer *)*plVar3;
      }
      local_2c0 = plVar3[1];
      *plVar3 = (long)ppbVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_368._M_allocated_capacity = (size_type)&local_358;
      ppcVar8 = (pointer *)(plVar3 + 2);
      if ((pointer *)*plVar3 == ppcVar8) {
        local_358 = *ppcVar8;
        lStack_350 = plVar3[3];
      }
      else {
        local_358 = *ppcVar8;
        local_368._M_allocated_capacity = (size_type)(pointer *)*plVar3;
      }
      local_368._8_8_ = plVar3[1];
      *plVar3 = (long)ppcVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_368._M_local_buf,(ulong)local_408._M_dataplus._M_p);
      local_348 = &local_338;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_338 = *plVar3;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar3;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
    }
    else {
      local_2a8[0] = (pointer)local_298;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a8,local_408._M_dataplus._M_p,
                 local_408._M_dataplus._M_p + local_408._M_string_length);
      std::__cxx11::string::append((char *)local_2a8);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_2a8,(ulong)local_408._M_dataplus._M_p);
      local_268 = &local_258;
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_258 = *plVar7;
        lStack_250 = plVar3[3];
      }
      else {
        local_258 = *plVar7;
        local_268 = (long *)*plVar3;
      }
      local_260 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append(local_298 + 0x30);
      local_248 = &local_238;
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_238 = *plVar7;
        lStack_230 = plVar3[3];
      }
      else {
        local_238 = *plVar7;
        local_248 = (long *)*plVar3;
      }
      local_240 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_248,(ulong)local_408._M_dataplus._M_p);
      local_228 = &local_218;
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_218 = *plVar7;
        lStack_210 = plVar3[3];
      }
      else {
        local_218 = *plVar7;
        local_228 = (long *)*plVar3;
      }
      local_220 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ppcVar8 = (pointer *)(puVar4 + 2);
      if ((pointer *)*puVar4 == ppcVar8) {
        local_2d8 = *ppcVar8;
        uStack_2d0 = puVar4[3];
      }
      else {
        local_2d8 = *ppcVar8;
        local_2e8._M_allocated_capacity = (size_type)(pointer *)*puVar4;
      }
      local_2e8._8_8_ = puVar4[1];
      *puVar4 = ppcVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_2e8._M_local_buf,(ulong)local_408._M_dataplus._M_p);
      local_2c8 = &local_2b8;
      ppbVar6 = (pointer *)(puVar4 + 2);
      if ((pointer *)*puVar4 == ppbVar6) {
        local_2b8 = *ppbVar6;
        lStack_2b0 = puVar4[3];
      }
      else {
        local_2b8 = *ppbVar6;
        local_2c8 = (pointer *)*puVar4;
      }
      local_2c0 = puVar4[1];
      *puVar4 = ppbVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      ppcVar8 = (pointer *)(puVar4 + 2);
      if ((pointer *)*puVar4 == ppcVar8) {
        local_358 = *ppcVar8;
        lStack_350 = puVar4[3];
        local_368._M_allocated_capacity = (size_type)&local_358;
      }
      else {
        local_358 = *ppcVar8;
        local_368._M_allocated_capacity = (size_type)(pointer *)*puVar4;
      }
      local_368._8_8_ = puVar4[1];
      *puVar4 = ppcVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_1c8[0]._M_dataplus._M_p = (pointer)0x26;
      local_208._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)local_1c8);
      local_208.field_2._M_allocated_capacity = (size_type)local_1c8[0]._M_dataplus._M_p;
      builtin_strncpy(local_208._M_dataplus._M_p,"\tunused = sin(sin(sin(sin(unused))));\n",0x26);
      local_208._M_string_length = (size_type)local_1c8[0]._M_dataplus._M_p;
      local_208._M_dataplus._M_p[(long)local_1c8[0]._M_dataplus._M_p] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      repeat((string *)(local_298 + 0x10),&local_208,iVar12,&local_50);
      pcVar13 = (pointer)0xf;
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        pcVar13 = local_358;
      }
      if (pcVar13 < (pointer)(local_298._24_8_ + local_368._8_8_)) {
        pcVar13 = (pointer)0xf;
        if ((undefined1 *)local_298._16_8_ != local_298 + 0x20) {
          pcVar13 = (pointer)local_298._32_8_;
        }
        if (pcVar13 < (pointer)(local_298._24_8_ + local_368._8_8_)) goto LAB_01041896;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)(local_298 + 0x10),0,(char *)0x0,local_368._M_allocated_capacity)
        ;
      }
      else {
LAB_01041896:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_368._M_local_buf,local_298._16_8_);
      }
      local_348 = &local_338;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_338 = *plVar3;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar3;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
    }
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    psVar11 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_308.field_2._M_allocated_capacity = *psVar11;
      local_308.field_2._8_8_ = puVar4[3];
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar11;
      local_308._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_308._M_string_length = puVar4[1];
    *puVar4 = psVar11;
    puVar4[1] = 0;
    *(undefined1 *)psVar11 = 0;
    if (optimized) {
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,(ulong)(local_358 + 1));
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,(ulong)((long)&(local_2b8->_M_dataplus)._M_p + 1));
      }
      local_298._0_8_ = local_2d8;
      uVar5 = local_2e8._M_allocated_capacity;
      if ((pointer *)local_2e8._M_allocated_capacity != &local_2d8) {
LAB_01041b6b:
        operator_delete((void *)uVar5,(ulong)(local_298._0_8_ + 1));
      }
    }
    else {
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if ((undefined1 *)local_298._16_8_ != local_298 + 0x20) {
        operator_delete((void *)local_298._16_8_,(ulong)(local_298._32_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        (ulong)(local_208.field_2._M_allocated_capacity + 1));
      }
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,(ulong)(local_358 + 1));
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,(ulong)((long)&(local_2b8->_M_dataplus)._M_p + 1));
      }
      if ((pointer *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,(ulong)(local_2d8 + 1));
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      uVar5 = local_2a8[0];
      if (local_2a8[0] != (pointer)local_298) goto LAB_01041b6b;
    }
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    if (optimized) {
      paVar9 = &local_308.field_2;
      psVar11 = &local_308._M_string_length;
      local_308._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_368._M_allocated_capacity = (size_type)&local_358;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_408._M_dataplus._M_p,
                 local_408._M_dataplus._M_p + local_408._M_string_length);
      std::__cxx11::string::append(local_368._M_local_buf);
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_368._M_local_buf,(ulong)local_408._M_dataplus._M_p);
      local_348 = &local_338;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_338 = *plVar3;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar3;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_308.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar4[3];
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar4;
      }
      psVar11 = puVar4 + 1;
      local_308._M_string_length = puVar4[1];
      *puVar4 = paVar9;
    }
    *psVar11 = 0;
    paVar9->_M_local_buf[0] = '\0';
    if (!optimized) {
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      local_298._0_8_ = local_358;
      uVar5 = local_368._M_allocated_capacity;
      if ((pointer *)local_368._M_allocated_capacity != &local_358) goto LAB_01041b6b;
    }
  }
  else {
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,0x1b3c1e9);
  }
  switch(this->m_caseType) {
  case CASETYPE_DEAD_BRANCH_SIMPLE:
    if (!optimized) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      iVar12 = 4;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar12 = 0x10;
      }
      std::ostream::operator<<(local_1c8,iVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x1c2b864);
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448.field_2._8_8_ = puVar4[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_448._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
      goto LAB_01042606;
    }
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_1c8[0]._M_dataplus._M_p = (pointer)0x2b;
    local_468._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)local_1c8);
LAB_01041c4b:
    local_468.field_2._M_allocated_capacity = (size_type)local_1c8[0]._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1b) = ',';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1c) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1d) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1e) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1f) = '9';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x21) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x22) = '*';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x23) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x24) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x25) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x26) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x27) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x28) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x29) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x2a) = '\n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x10) = '6';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x11) = ',';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x12) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x13) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x14) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x15) = '7';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x16) = ',';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x17) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x18) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x19) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1a) = '8';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1b) = ',';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1c) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1d) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1e) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x1f) = '9';
    *(undefined8 *)local_468._M_dataplus._M_p = 0x3d2065756c617609;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 9) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 10) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xb) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xc) = '4';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xe) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xf) = '.';
    local_468._M_string_length = (size_type)local_1c8[0]._M_dataplus._M_p;
    local_468._M_dataplus._M_p[(long)local_1c8[0]._M_dataplus._M_p] = '\0';
    break;
  case CASETYPE_DEAD_BRANCH_COMPLEX:
    useConst = true;
    goto LAB_01041cee;
  case CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST:
    useConst = false;
LAB_01041cee:
    deadBranchComplexCaseStatements
              (&local_468,optimized,&local_408,useConst,CVar1 == CASESHADERTYPE_VERTEX);
    goto LAB_01042f6c;
  case CASETYPE_DEAD_BRANCH_FUNC_CALL:
    if (optimized) {
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      local_1c8[0]._M_dataplus._M_p = (pointer)0x2b;
      local_468._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)local_1c8);
      goto LAB_01041c4b;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    iVar12 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0x10;
    }
    std::ostream::operator<<(local_1c8,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x1c2b9cc);
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_448.field_2._8_8_ = puVar4[3];
    }
    else {
      local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_448._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_448._M_string_length = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
LAB_01042606:
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    pcVar10 = (char *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar10) {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468.field_2._8_8_ = puVar4[3];
    }
    else {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_468._M_string_length = puVar4[1];
    *puVar4 = pcVar10;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    break;
  case CASETYPE_UNUSED_VALUE_BASIC:
    iVar12 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (!optimized) {
      std::operator+(&local_328,"\t",&local_408);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_3d8;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar9) {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        lStack_3d0 = plVar3[3];
      }
      else {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar3;
      }
      local_3e0 = plVar3[1];
      *plVar3 = (long)paVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_408._M_dataplus._M_p)
      ;
      local_428 = &local_418;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_418._8_8_ = puVar4[3];
      }
      else {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_420 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448.field_2._8_8_ = puVar4[3];
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      }
      else {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_448._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_388._M_allocated_capacity = (size_type)&local_378;
      local_3a8._M_dataplus._M_p = (pointer)0x26;
      local_388._M_allocated_capacity =
           std::__cxx11::string::_M_create(&local_388._M_allocated_capacity,(ulong)&local_3a8);
      local_378._M_allocated_capacity = (size_type)local_3a8._M_dataplus._M_p;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_388._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x6973286e6973286e;
      *(undefined8 *)(local_388._M_allocated_capacity + 0x18) = 0x646573756e75286e;
      *(undefined8 *)local_388._M_allocated_capacity = 0x20646573756e7509;
      *(undefined8 *)(local_388._M_allocated_capacity + 8) = 0x6973286e6973203d;
      builtin_strncpy((char *)(local_388._M_allocated_capacity + 0x1e),"ed))));\n",8);
      local_388._8_8_ = local_3a8._M_dataplus._M_p;
      local_3a8._M_dataplus._M_p[local_388._M_allocated_capacity] = '\0';
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity =
           local_3a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      repeat(&local_3c8,(string *)&local_388,iVar12,&local_3a8);
      uVar5 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        uVar5 = local_448.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_3c8._M_string_length + local_448._M_string_length) {
        uVar5 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          uVar5 = local_3c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < local_3c8._M_string_length + local_448._M_string_length)
        goto LAB_0104258f;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_3c8,0,(char *)0x0,(ulong)local_448._M_dataplus._M_p);
      }
      else {
LAB_0104258f:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_448,(ulong)local_3c8._M_dataplus._M_p);
      }
      local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_1c8[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
        local_1c8[0].field_2._8_8_ = puVar4[3];
      }
      else {
        local_1c8[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
        local_1c8[0]._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_1c8[0]._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1c8);
      goto LAB_01042aab;
    }
    std::operator+(local_1c8,"\t",&local_408);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1c8);
LAB_01041dc9:
    pcVar10 = (char *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar10) {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468.field_2._8_8_ = puVar4[3];
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    }
    else {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468._M_dataplus._M_p = (pointer)*puVar4;
    }
    goto LAB_01042ad8;
  case CASETYPE_UNUSED_VALUE_LOOP:
    iVar12 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0x10;
    }
    if (optimized) {
      std::operator+(&local_448,"\t",&local_408);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
      pcVar10 = (char *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar10) {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468.field_2._8_8_ = puVar4[3];
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      }
      else {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468._M_dataplus._M_p = (pointer)*puVar4;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,"\t",&local_408);
      puVar4 = (undefined8 *)std::__cxx11::string::append(local_388._M_local_buf);
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_3c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_3c8.field_2._8_8_ = puVar4[3];
      }
      else {
        local_3c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_3c8._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_3c8._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_408._M_dataplus._M_p)
      ;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_328.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_328.field_2._8_8_ = puVar4[3];
      }
      else {
        local_328.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_328._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_328._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        lStack_3d0 = puVar4[3];
        local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_3d8;
      }
      else {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_3e0 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,iVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      pcVar13 = (pointer)0xf;
      if (local_3e8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3d8) {
        pcVar13 = local_3d8;
      }
      if (pcVar13 < (pointer)(local_3a8._M_string_length + local_3e0)) {
        uVar5 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          uVar5 = local_3a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (pointer)(local_3a8._M_string_length + local_3e0)) goto LAB_01042759;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_3e8);
      }
      else {
LAB_01042759:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3e8,(ulong)local_3a8._M_dataplus._M_p);
      }
      local_428 = &local_418;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_418._8_8_ = puVar4[3];
      }
      else {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_420 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      pcVar10 = (char *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar10) {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468.field_2._8_8_ = puVar4[3];
      }
      else {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468._M_dataplus._M_p = (pointer)*puVar4;
      }
    }
    local_468._M_string_length = puVar4[1];
    *puVar4 = pcVar10;
    puVar4[1] = 0;
    *pcVar10 = '\0';
    if (optimized) {
      uVar5 = local_448.field_2._M_allocated_capacity;
      uVar14 = local_448._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p == &local_448.field_2) goto LAB_01042f6c;
    }
    else {
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,
                        (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
      }
      if (local_3e8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3d8) {
        operator_delete(local_3e8,(ulong)(local_3d8 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_378._M_allocated_capacity;
      uVar14 = local_388._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_allocated_capacity == &local_378) goto LAB_01042f6c;
    }
    goto LAB_01042f64;
  case CASETYPE_UNUSED_VALUE_DEAD_BRANCH:
    iVar12 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (optimized) {
      std::operator+(local_1c8,"\t",&local_408);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1c8);
      goto LAB_01041dc9;
    }
    std::operator+(&local_328,"\t",&local_408);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
    local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&local_3d8;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_3d8 = (pointer)paVar9->_M_allocated_capacity;
      lStack_3d0 = puVar4[3];
    }
    else {
      local_3d8 = (pointer)paVar9->_M_allocated_capacity;
      local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4;
    }
    local_3e0 = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_408._M_dataplus._M_p);
    local_428 = &local_418;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_418._8_8_ = puVar4[3];
    }
    else {
      local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4;
    }
    local_420 = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_448.field_2._8_8_ = puVar4[3];
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    }
    else {
      local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_448._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_448._M_string_length = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_388._M_allocated_capacity = (size_type)&local_378;
    local_3a8._M_dataplus._M_p = (pointer)0x26;
    local_388._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_388._M_allocated_capacity,(ulong)&local_3a8);
    local_378._M_allocated_capacity = (size_type)local_3a8._M_dataplus._M_p;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_388._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x6973286e6973286e;
    *(undefined8 *)(local_388._M_allocated_capacity + 0x18) = 0x646573756e75286e;
    *(undefined8 *)local_388._M_allocated_capacity = 0x20646573756e7509;
    *(undefined8 *)(local_388._M_allocated_capacity + 8) = 0x6973286e6973203d;
    builtin_strncpy((char *)(local_388._M_allocated_capacity + 0x1e),"ed))));\n",8);
    local_388._8_8_ = local_3a8._M_dataplus._M_p;
    local_3a8._M_dataplus._M_p[local_388._M_allocated_capacity] = '\0';
    local_3a8._M_string_length = 0;
    local_3a8.field_2._M_allocated_capacity =
         local_3a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    repeat(&local_3c8,(string *)&local_388,iVar12,&local_3a8);
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      uVar5 = local_448.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_3c8._M_string_length + local_448._M_string_length) {
      uVar5 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        uVar5 = local_3c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_3c8._M_string_length + local_448._M_string_length) goto LAB_0104287f;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_3c8,0,(char *)0x0,(ulong)local_448._M_dataplus._M_p);
    }
    else {
LAB_0104287f:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_448,(ulong)local_3c8._M_dataplus._M_p)
      ;
    }
    local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_1c8[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
      local_1c8[0].field_2._8_8_ = puVar4[3];
    }
    else {
      local_1c8[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
      local_1c8[0]._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_1c8[0]._M_string_length = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    paVar9->_M_local_buf[0] = '\0';
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1c8);
LAB_01042aab:
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    pcVar10 = (char *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar10) {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468.field_2._8_8_ = puVar4[3];
    }
    else {
      local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
      local_468._M_dataplus._M_p = (pointer)*puVar4;
    }
LAB_01042ad8:
    local_468._M_string_length = puVar4[1];
    *puVar4 = pcVar10;
    puVar4[1] = 0;
    *pcVar10 = '\0';
    if (optimized) {
LAB_01042cb7:
      uVar5 = local_1c8[0].field_2._M_allocated_capacity;
      uVar14 = local_1c8[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8[0]._M_dataplus._M_p == &local_1c8[0].field_2) goto LAB_01042f6c;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
        operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,
                        (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_allocated_capacity != &local_378) {
        operator_delete((void *)local_388._M_allocated_capacity,local_378._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418._M_allocated_capacity + 1);
      }
      if (local_3e8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3d8) {
        operator_delete(local_3e8,(ulong)(local_3d8 + 1));
      }
      uVar5 = local_328.field_2._M_allocated_capacity;
      uVar14 = local_328._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p == &local_328.field_2) goto LAB_01042f6c;
    }
    goto LAB_01042f64;
  case CASETYPE_UNUSED_VALUE_AFTER_RETURN:
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_1c8[0]._M_dataplus._M_p = &DAT_00000016;
    local_468._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)local_1c8);
    local_468.field_2._M_allocated_capacity = (size_type)local_1c8[0]._M_dataplus._M_p;
    *(undefined8 *)local_468._M_dataplus._M_p = 0x3d2065756c617609;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 9) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 10) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xb) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xc) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x11) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x12) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x13) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x14) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p + 0x15) = '\n';
    local_468._M_string_length = (size_type)local_1c8[0]._M_dataplus._M_p;
    local_468._M_dataplus._M_p[(long)local_1c8[0]._M_dataplus._M_p] = '\0';
    goto LAB_01042f6c;
  case CASETYPE_UNUSED_VALUE_MUL_ZERO:
    iVar12 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (optimized) {
      std::operator+(local_1c8,"\t",&local_408);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1c8);
      pcVar10 = (char *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar10) {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468.field_2._8_8_ = puVar4[3];
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      }
      else {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468._M_dataplus._M_p = (pointer)*puVar4;
      }
    }
    else {
      std::operator+(&local_3c8,"\t",&local_408);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_328.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_328.field_2._8_8_ = puVar4[3];
      }
      else {
        local_328.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_328._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_328._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_408._M_dataplus._M_p)
      ;
      local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_3d8;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        lStack_3d0 = puVar4[3];
      }
      else {
        local_3d8 = (pointer)paVar9->_M_allocated_capacity;
        local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_3e0 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_418._8_8_ = puVar4[3];
        local_428 = &local_418;
      }
      else {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_420 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)0x26;
      local_3a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_1e8);
      local_3a8.field_2._M_allocated_capacity = (size_type)local_1e8._M_dataplus._M_p;
      *(char *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3a8._M_dataplus._M_p)[0x10]._M_allocated_capacity = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x11) = '(';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x12) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x13) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x14) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x15) = '(';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x16) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x17) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x18) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x19) = '(';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1a) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1b) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1c) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1d) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1e) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1f) = 'd';
      *(undefined8 *)local_3a8._M_dataplus._M_p = 0x20646573756e7509;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 8) = '=';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 9) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0xb) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0xc) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0xd) = '(';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0xe) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1e) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x1f) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x20) = ')';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x21) = ')';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x22) = ')';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x23) = ')';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x24) = ';';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p + 0x25) = '\n';
      local_3a8._M_string_length = (size_type)local_1e8._M_dataplus._M_p;
      local_1e8._M_dataplus._M_p[(long)local_3a8._M_dataplus._M_p] = '\0';
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      repeat((string *)&local_388,&local_3a8,iVar12,&local_1e8);
      uVar5 = 0xf;
      if (local_428 != &local_418) {
        uVar5 = local_418._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (ulong)(local_420 + local_388._8_8_)) {
        uVar5 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_allocated_capacity != &local_378) {
          uVar5 = local_378._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (ulong)(local_420 + local_388._8_8_)) goto LAB_010429a2;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_428);
      }
      else {
LAB_010429a2:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_428,local_388._M_allocated_capacity)
        ;
      }
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar9) {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448.field_2._8_8_ = puVar4[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_448._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_448._M_string_length = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      pcVar10 = (char *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar10) {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468.field_2._8_8_ = puVar4[3];
      }
      else {
        local_468.field_2._M_allocated_capacity = *(undefined8 *)pcVar10;
        local_468._M_dataplus._M_p = (pointer)*puVar4;
      }
    }
    local_468._M_string_length = puVar4[1];
    *puVar4 = pcVar10;
    puVar4[1] = 0;
    *pcVar10 = '\0';
    if (!optimized) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_allocated_capacity != &local_378) {
        operator_delete((void *)local_388._M_allocated_capacity,local_378._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,
                        (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418._M_allocated_capacity + 1);
      }
      if (local_3e8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3d8) {
        operator_delete(local_3e8,(ulong)(local_3d8 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_3c8.field_2._M_allocated_capacity;
      uVar14 = local_3c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) goto LAB_01042f6c;
      goto LAB_01042f64;
    }
    goto LAB_01042cb7;
  default:
switchD_01041b92_default:
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,
                      (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
    }
    if (local_3e8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(ulong)CVar1) {
      operator_delete(local_3e8,(ulong)(local_3d8 + 1));
    }
    if ((ProgramData *)local_328._M_dataplus._M_p != __return_storage_ptr__) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_allocated_capacity != &local_378) {
      operator_delete((void *)local_388._M_allocated_capacity,local_378._M_allocated_capacity + 1);
    }
    if (optimized) {
      Performance::(anonymous_namespace)::DeadCodeEliminationCase::generateProgramData();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if (local_408._M_dataplus._M_p != (pointer)((long)&local_408 + 0x10)) {
      operator_delete(local_408._M_dataplus._M_p,
                      CONCAT17(local_408.field_2._M_local_buf[7],
                               CONCAT25(local_408.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_408.field_2._M_local_buf[4],
                                                 local_408.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar5);
  }
  if (!optimized) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_418._M_allocated_capacity;
    uVar14 = local_428;
    if (local_428 != &local_418) {
LAB_01042f64:
      operator_delete((void *)uVar14,uVar5 + 1);
    }
  }
LAB_01042f6c:
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &local_308,&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,(ulong)(local_468.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_408._M_dataplus._M_p != (pointer)((long)&local_408 + 0x10)) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT17(local_408.field_2._M_local_buf[7],
                             CONCAT25(local_408.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_408.field_2._M_local_buf[4],
                                               local_408.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	funcDefs		= m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL		? deadBranchFuncCallCaseFuncDefs		(optimized, precision)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN	? unusedValueAfterReturnCaseFuncDefs	(optimized, precision, isVertexCase)
										: "";

		const string	statements		= m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE				? deadBranchSimpleCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX			? deadBranchComplexCaseStatements			(optimized, precision, true,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? deadBranchComplexCaseStatements			(optimized, precision, false,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL			? deadBranchFuncCallCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_BASIC				? unusedValueBasicCaseStatements			(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_LOOP				? unusedValueLoopCaseStatements				(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? unusedValueDeadBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN		? unusedValueAfterReturnCaseStatements		()
										: m_caseType == CASETYPE_UNUSED_VALUE_MUL_ZERO			? unusedValueMulZeroCaseStatements			(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, funcDefs, statements);
	}